

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaONE2(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  Rgba *pRVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  undefined4 in_R8D;
  Box2i range;
  int tileX;
  int tileY;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff24;
  Vec2<float> *this;
  int xMax;
  int in_stack_ffffffffffffff3c;
  int h;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff60;
  int yMax;
  undefined4 in_stack_ffffffffffffff64;
  Vec2<float> *sizeX;
  int local_74;
  int local_70;
  int local_64;
  int local_60;
  Array2D<Imf_3_2::Rgba> local_50;
  Vec2<float> local_38;
  Rgba local_30 [6];
  
  this = &local_38;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  h = 3;
  xMax = 0;
  uVar5 = 0;
  sizeX = this;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_30,in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,0,0,0xf);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_RDI,(long)sizeX,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_60 = 0;
  while( true ) {
    yMax = local_60;
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)local_30);
    if (iVar2 <= yMax) break;
    local_64 = 0;
    while( true ) {
      iVar2 = local_64;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)local_30);
      if (iVar3 <= iVar2) break;
      Imf_3_2::TiledRgbaOutputFile::dataWindowForTile((int)&local_74,(int)local_30,local_64);
      uVar5 = 0;
      drawImage3((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff4c,uVar1),
                 in_stack_ffffffffffffff44,h,in_stack_ffffffffffffff3c,xMax,
                 (int)((ulong)this >> 0x20),yMax,(int)sizeX,(int)in_RDI);
      pRVar4 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_50,(long)-local_70);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer(local_30,(ulong)(pRVar4 + -local_74),1);
      Imf_3_2::TiledRgbaOutputFile::writeTile((int)local_30,local_64,local_60);
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff24,uVar5));
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeTiledRgbaONE2 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with one level using a tile-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,  // tile size
        ONE_LEVEL,   // level mode
        ROUND_DOWN,  // rounding mode
        WRITE_RGBA); // channels in file

    Array2D<Rgba> pixels (tileHeight, tileWidth);

    for (int tileY = 0; tileY < out.numYTiles (); ++tileY)
    {
        for (int tileX = 0; tileX < out.numXTiles (); ++tileX)
        {
            Box2i range = out.dataWindowForTile (tileX, tileY);

            drawImage3 (
                pixels,
                width,
                height,
                range.min.x,
                range.max.x + 1,
                range.min.y,
                range.max.y + 1,
                0,
                0);

            out.setFrameBuffer (
                &pixels[-range.min.y][-range.min.x],
                1,          // xStride
                tileWidth); // yStride

            out.writeTile (tileX, tileY);
        }
    }
}